

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O2

u4 __thiscall ClassLoader::readU4(ClassLoader *this,FILE *fp)

{
  byte bVar1;
  u4 uVar2;
  int iVar3;
  u4 local_1c;
  
  local_1c = 0;
  if (this->isLittleEndian == true) {
    uVar2 = 0;
    for (iVar3 = 0x18; iVar3 != -8; iVar3 = iVar3 + -8) {
      bVar1 = readU1(this,fp);
      uVar2 = uVar2 + ((uint)bVar1 << ((byte)iVar3 & 0x1f));
    }
  }
  else {
    fread(&local_1c,4,1,(FILE *)fp);
    uVar2 = local_1c;
  }
  return uVar2;
}

Assistant:

u4 ClassLoader::readU4(FILE *fp) {
    u4 result = 0;
    
    if (isLittleEndian) {
        for (int i = 0; i < 4; i++) {
            result += readU1(fp) << (24 - 8*i);
        }
    } else {
        fread(&result, sizeof(u4), 1, fp);
    }
    
    return result;
}